

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<std::__cxx11::string>::
GetDescriberImpl<testing::internal::MatcherBase<std::__cxx11::string>::ValuePolicy<testing::internal::EqMatcher<char_const*>,true>>
          (MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<basic_string<char>_>_*,_const_EqMatcher<const_char_*>_*>_>
  *ppMVar1;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  tuple<const_testing::internal::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_testing::internal::EqMatcher<const_char_*>_*>
  local_20;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ValuePolicy<testing::internal::EqMatcher<const_char_*>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<std::__cxx11::string>const*,testing::internal::EqMatcher<char_const*>const*>
            ((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)&local_20,(EqMatcher<const_char_*> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<std::__cxx11::string>const*,testing::internal::EqMatcher<char_const*>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }